

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sptk_utils.cc
# Opt level: O2

bool sptk::WriteStream<unsigned_short>
               (int write_point,int write_size,
               vector<unsigned_short,_std::allocator<unsigned_short>_> *sequence_to_write,
               ostream *output_stream,int *actual_write_size)

{
  int iVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  
  if (output_stream == (ostream *)0x0 || (write_size < 1 || write_point < 0)) {
    bVar4 = false;
  }
  else {
    lVar3 = *(long *)sequence_to_write;
    bVar4 = false;
    iVar1 = 0;
    if ((ulong)(uint)(write_size + write_point) <=
        (ulong)(*(long *)(sequence_to_write + 8) - lVar3 >> 1)) {
      if (actual_write_size != (int *)0x0) {
        iVar1 = std::ostream::tellp();
        lVar3 = *(long *)sequence_to_write;
      }
      std::ostream::write((char *)output_stream,lVar3 + (ulong)(uint)write_point * 2);
      if (actual_write_size != (int *)0x0) {
        iVar2 = std::ostream::tellp();
        *actual_write_size = (iVar2 - iVar1) / 2;
      }
      bVar4 = ((byte)output_stream[*(long *)(*(long *)output_stream + -0x18) + 0x20] & 5) == 0;
    }
  }
  return bVar4;
}

Assistant:

bool WriteStream(int write_point, int write_size,
                 const std::vector<T>& sequence_to_write,
                 std::ostream* output_stream, int* actual_write_size) {
  if (write_point < 0 || write_size <= 0 || NULL == output_stream) {
    return false;
  }

  const int end(write_point + write_size);
  if (sequence_to_write.size() < static_cast<std::size_t>(end)) {
    return false;
  }

  const int before((NULL == actual_write_size)
                       ? 0
                       : static_cast<int>(output_stream->tellp()));

  output_stream->write(
      reinterpret_cast<const char*>(&(sequence_to_write[0]) + write_point),
      sizeof(sequence_to_write[0]) * write_size);

  // When output_stream is cout, actual_write_size is always zero.
  if (NULL != actual_write_size) {
    const int after(static_cast<int>(output_stream->tellp()));
    const int type_byte(sizeof(sequence_to_write[0]));
    *actual_write_size = (after - before) / type_byte;
  }

  return !output_stream->fail();
}